

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  ulong uVar1;
  BPMNode *pBVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  undefined4 uVar5;
  BPMNode **__ptr;
  bool bVar6;
  uint uVar7;
  int iVar8;
  BPMNode *leaves;
  BPMNode *pBVar9;
  ulong uVar10;
  ulong uVar11;
  BPMNode **__ptr_00;
  BPMNode **ppBVar12;
  ulong uVar13;
  BPMNode *pBVar14;
  BPMNode *pBVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  BPMLists lists;
  
  if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < (uint)numcodes || numcodes == 0) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  uVar19 = 0;
  for (uVar7 = 0; uVar7 != numcodes; uVar7 = uVar7 + 1) {
    if (frequencies[uVar7] != 0) {
      leaves[uVar19].weight = frequencies[uVar7];
      leaves[uVar19].index = uVar7;
      uVar19 = uVar19 + 1;
    }
  }
  for (uVar7 = 0; uVar7 != numcodes; uVar7 = uVar7 + 1) {
    lengths[uVar7] = 0;
  }
  if (uVar19 == 1) {
    uVar7 = leaves->index;
    lengths[uVar7] = 1;
    lengths[(ulong)uVar7 == 0] = 1;
  }
  else {
    if (uVar19 != 0) {
      pBVar9 = (BPMNode *)malloc(uVar19 * 0x18);
      bVar6 = false;
      uVar13 = 1;
      while (uVar13 < uVar19) {
        pBVar14 = leaves;
        pBVar4 = pBVar9;
        if (!bVar6) {
          pBVar14 = pBVar9;
          pBVar4 = leaves;
        }
        uVar16 = 0;
        while (uVar16 < uVar19) {
          uVar20 = uVar16 + uVar13;
          if (uVar19 <= uVar16 + uVar13) {
            uVar20 = uVar19;
          }
          uVar1 = uVar16 + uVar13 * 2;
          uVar10 = uVar20;
          pBVar15 = pBVar14;
          uVar17 = uVar16;
          uVar21 = uVar19;
          if (uVar1 < uVar19) {
            uVar21 = uVar1;
          }
          for (; uVar16 < uVar21; uVar16 = uVar16 + 1) {
            if ((uVar17 < uVar20) &&
               ((uVar21 <= uVar10 || (pBVar4[uVar17].weight <= pBVar4[uVar10].weight)))) {
              uVar18 = uVar17 + 1;
              uVar11 = uVar10;
            }
            else {
              uVar11 = uVar10 + 1;
              uVar18 = uVar17;
              uVar17 = uVar10;
            }
            uVar5 = *(undefined4 *)&pBVar4[uVar17].field_0x14;
            pBVar15->in_use = pBVar4[uVar17].in_use;
            *(undefined4 *)&pBVar15->field_0x14 = uVar5;
            pBVar2 = pBVar4 + uVar17;
            uVar7 = pBVar2->index;
            pBVar3 = pBVar2->tail;
            pBVar15->weight = pBVar2->weight;
            pBVar15->index = uVar7;
            pBVar15->tail = pBVar3;
            uVar10 = uVar11;
            pBVar15 = pBVar15 + 1;
            uVar17 = uVar18;
          }
          pBVar14 = pBVar14 + uVar13 * 2;
          uVar16 = uVar1;
        }
        bVar6 = (bool)(bVar6 ^ 1);
        uVar13 = uVar13 * 2;
      }
      if (bVar6) {
        memcpy(leaves,pBVar9,uVar19 * 0x18);
      }
      free(pBVar9);
      lists.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar13 = (ulong)lists.memsize;
      lists.nextfree = 0;
      lists.numfree = lists.memsize;
      lists.listsize = maxbitlen;
      pBVar9 = (BPMNode *)malloc(uVar13 * 0x18);
      lists.memory = pBVar9;
      __ptr_00 = (BPMNode **)malloc(uVar13 * 8);
      lists.freelist = __ptr_00;
      ppBVar12 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      lists.chains0 = ppBVar12;
      lists.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      auVar22._0_4_ = -(uint)((int)((ulong)pBVar9 >> 0x20) == 0 && (int)pBVar9 == 0);
      auVar22._4_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
      auVar22._8_4_ = -(uint)((int)((ulong)ppBVar12 >> 0x20) == 0 && (int)ppBVar12 == 0);
      auVar22._12_4_ = -(uint)((int)lists.chains1 == 0 && (int)((ulong)lists.chains1 >> 0x20) == 0);
      iVar8 = movmskps((int)lists.chains1,auVar22);
      uVar7 = 0x53;
      if (iVar8 == 0) {
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          __ptr_00[uVar16] = pBVar9;
          pBVar9 = pBVar9 + 1;
        }
        bpmnode_create(&lists,leaves->weight,1,(BPMNode *)0x0);
        uVar13 = 2;
        bpmnode_create(&lists,leaves[1].weight,2,(BPMNode *)0x0);
        for (uVar16 = 0; lists.listsize != uVar16; uVar16 = uVar16 + 1) {
          lists.chains0[uVar16] = lists.memory;
          lists.chains1[uVar16] = lists.memory + 1;
        }
        for (; uVar19 * 2 - 2 != uVar13; uVar13 = (ulong)((int)uVar13 + 1)) {
          boundaryPM(&lists,leaves,uVar19,maxbitlen - 1,(int)uVar13);
        }
        ppBVar12 = lists.chains1 + (maxbitlen - 1);
        while (pBVar9 = *ppBVar12, pBVar9 != (BPMNode *)0x0) {
          for (uVar19 = 0; (uint)uVar19 != pBVar9->index; uVar19 = (ulong)((uint)uVar19 + 1)) {
            lengths[leaves[uVar19].index] = lengths[leaves[uVar19].index] + 1;
          }
          ppBVar12 = &pBVar9->tail;
        }
        uVar7 = 0;
        ppBVar12 = lists.chains0;
        pBVar9 = lists.memory;
        __ptr_00 = lists.freelist;
      }
      __ptr = lists.chains1;
      free(pBVar9);
      free(__ptr_00);
      free(ppBVar12);
      free(__ptr);
      goto LAB_00103b32;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar7 = 0;
LAB_00103b32:
  free(leaves);
  return uVar7;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}